

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

bool tcu::floatThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,Vec4 *threshold,CompareLogMode logMode)

{
  int width;
  int height;
  int depth;
  ChannelOrder CVar1;
  TextureFormat TVar2;
  TextureFormat TVar3;
  ulong uVar4;
  TextureChannelClass TVar5;
  InternalError *this;
  ulong uVar6;
  ConstPixelBufferAccess *pCVar7;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int z;
  ChannelOrder __fd;
  _Alloc_hider _Var8;
  int z_00;
  int y;
  bool bVar9;
  float fVar10;
  float fVar14;
  float fVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar16;
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  Vector<bool,_4> res;
  Vec4 cmpPix;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  Vec4 refPix;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  ConstPixelBufferAccess *local_4c0;
  TextureFormat local_4b8;
  Vec4 *local_4b0;
  Vec4 local_4a8;
  Vec4 local_498;
  string local_488;
  string local_468;
  char *local_448;
  char *local_440;
  Vector<float,_4> local_438;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  LogImageSet local_368;
  undefined1 local_328 [8];
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  _Alloc_hider local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [6];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [6];
  ConstPixelBufferAccess local_208;
  TextureLevel local_1e0;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  
  width = (reference->m_size).m_data[0];
  height = (reference->m_size).m_data[1];
  depth = (reference->m_size).m_data[2];
  local_1b8._0_4_ = RGB;
  local_1b8._4_4_ = UNORM_INT8;
  local_4c0 = reference;
  local_4b0 = threshold;
  TextureLevel::TextureLevel(&local_1e0,(TextureFormat *)local_1b8,width,height,depth);
  TextureLevel::getAccess((PixelBufferAccess *)&local_208,&local_1e0);
  local_438.m_data[0] = 0.0;
  local_438.m_data[1] = 0.0;
  local_438.m_data[2] = 0.0;
  local_438.m_data[3] = 0.0;
  local_498.m_data[0] = 0.0;
  local_498.m_data[1] = 0.0;
  local_498.m_data[2] = 0.0;
  local_498.m_data[3] = 0.0;
  local_4a8.m_data[0] = 1.0;
  local_4a8.m_data[1] = 1.0;
  local_4a8.m_data[2] = 1.0;
  local_4a8.m_data[3] = 1.0;
  local_4b8 = (TextureFormat)log;
  local_448 = imageSetDesc;
  local_440 = imageSetName;
  if ((((result->m_size).m_data[0] != width) || ((result->m_size).m_data[1] != height)) ||
     ((result->m_size).m_data[2] != depth)) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x249);
    __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
  }
  if (0 < depth) {
    z_00 = 0;
    do {
      if (0 < height) {
        z = 0;
        do {
          if (0 < width) {
            y = 0;
            do {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_1b8,(int)local_4c0,y,z);
              ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_298,(int)result,y,z);
              auVar11._0_8_ =
                   CONCAT44((float)local_1b8._4_4_ - (float)local_298._4_4_,
                            (float)local_1b8._0_4_ - (float)local_298._0_4_) ^ 0x8000000080000000;
              auVar11._8_4_ = -(fStack_1b0 - fStack_290);
              auVar11._12_4_ = -(fStack_1ac - fStack_28c);
              auVar12._4_4_ = (float)local_1b8._4_4_ - (float)local_298._4_4_;
              auVar12._0_4_ = (float)local_1b8._0_4_ - (float)local_298._0_4_;
              auVar12._8_4_ = fStack_1b0 - fStack_290;
              auVar12._12_4_ = fStack_1ac - fStack_28c;
              auVar12 = maxps(auVar11,auVar12);
              fVar10 = auVar12._0_4_;
              fVar14 = auVar12._4_4_;
              fVar15 = auVar12._8_4_;
              fVar16 = auVar12._12_4_;
              auVar17._4_4_ = -(uint)(fVar14 <= local_4b0->m_data[1]);
              auVar17._0_4_ = -(uint)(fVar10 <= local_4b0->m_data[0]);
              auVar17._8_4_ = -(uint)(fVar15 <= local_4b0->m_data[2]);
              auVar17._12_4_ = -(uint)(fVar16 <= local_4b0->m_data[3]);
              auVar12 = packssdw(auVar17,auVar17);
              auVar12 = packsswb(auVar12,auVar12);
              if ((byte)(auVar12[0] & DAT_01b805f0) == 0) {
                bVar9 = false;
              }
              else {
                uVar4 = 0;
                do {
                  uVar6 = uVar4;
                  if (uVar6 == 3) break;
                  uVar4 = uVar6 + 1;
                } while (local_328[uVar6 + 1] != '\0');
                bVar9 = 2 < uVar6;
              }
              local_438.m_data[1] =
                   (float)(~-(uint)(fVar14 <= local_438.m_data[1]) & (uint)fVar14 |
                          (uint)local_438.m_data[1] & -(uint)(fVar14 <= local_438.m_data[1]));
              local_438.m_data[0] =
                   (float)(~-(uint)(fVar10 <= local_438.m_data[0]) & (uint)fVar10 |
                          (uint)local_438.m_data[0] & -(uint)(fVar10 <= local_438.m_data[0]));
              local_438.m_data[3] =
                   (float)(~-(uint)(fVar16 <= local_438.m_data[3]) & (uint)fVar16 |
                          (uint)local_438.m_data[3] & -(uint)(fVar16 <= local_438.m_data[3]));
              local_438.m_data[2] =
                   (float)(~-(uint)(fVar15 <= local_438.m_data[2]) & (uint)fVar15 |
                          (uint)local_438.m_data[2] & -(uint)(fVar15 <= local_438.m_data[2]));
              local_328._4_4_ = 0.0;
              if (bVar9) {
                local_328._0_4_ = 0.0;
                local_328._4_4_ = 1.0;
              }
              else {
                local_328._0_4_ = 1.0;
              }
              local_320 = 0x3f80000000000000;
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_208,(Vec4 *)local_328,y,z,z_00);
              y = y + 1;
            } while (y != width);
          }
          z = z + 1;
        } while (z != height);
      }
      z_00 = z_00 + 1;
    } while (z_00 != depth);
  }
  TVar2 = local_4b8;
  auVar13._4_4_ = -(uint)(local_438.m_data[1] <= local_4b0->m_data[1]);
  auVar13._0_4_ = -(uint)(local_438.m_data[0] <= local_4b0->m_data[0]);
  auVar13._8_4_ = -(uint)(local_438.m_data[2] <= local_4b0->m_data[2]);
  auVar13._12_4_ = -(uint)(local_438.m_data[3] <= local_4b0->m_data[3]);
  auVar12 = packssdw(auVar13,auVar13);
  auVar12 = packsswb(auVar12,auVar12);
  CVar1 = auVar12._0_4_ & (ChannelOrder)DAT_01b805f0;
  local_1b8._4_4_ = local_1b8._4_4_;
  local_1b8._0_4_ = CVar1;
  __fd = local_4b8.order;
  if ((char)CVar1 == '\0') {
    bVar9 = false;
LAB_0199586e:
    TVar5 = getTextureChannelClass((local_4c0->m_format).type);
    if ((TVar5 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ||
       (TVar5 = getTextureChannelClass((result->m_format).type),
       TVar5 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) {
      anon_unknown_50::computeScaleAndBias(local_4c0,result,&local_4a8,&local_498);
      TVar3 = local_4b8;
      local_4b8.order = TVar2.order;
      local_4b8.type = TVar2.type;
      local_1b8._0_4_ = local_4b8.order;
      local_1b8._4_4_ = local_4b8.type;
      local_4b8 = TVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_1b0,
                 "Result and reference images are normalized with formula p * ",0x3c);
      operator<<((ostream *)&fStack_1b0,&local_4a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0," + ",3);
      operator<<((ostream *)&fStack_1b0,&local_498);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
      std::ios_base::~ios_base(local_140);
    }
    TVar3 = local_4b8;
    if (bVar9 == false) {
      local_4b8.order = TVar2.order;
      local_4b8.type = TVar2.type;
      local_1b8._0_4_ = local_4b8.order;
      local_1b8._4_4_ = local_4b8.type;
      local_4b8 = TVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_1b0,"Image comparison failed: max difference = ",0x2a);
      operator<<((ostream *)&fStack_1b0,&local_438);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_1b0,", threshold = ",0xe);
      operator<<((ostream *)&fStack_1b0,local_4b0);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
      std::ios_base::~ios_base(local_140);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,local_440,&local_4c1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,local_448,&local_4c2);
    LogImageSet::LogImageSet(&local_368,&local_468,&local_488);
    TestLog::startImageSet
              ((TestLog *)TVar2,local_368.m_name._M_dataplus._M_p,
               local_368.m_description._M_dataplus._M_p);
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Result","");
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Result","");
    LogImage::LogImage((LogImage *)local_1b8,&local_3c8,&local_3e8,result,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b8,__fd,__buf_00,(size_t)result);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"Reference","");
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Reference","");
    pCVar7 = local_4c0;
    LogImage::LogImage((LogImage *)local_298,&local_408,&local_428,local_4c0,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_298,__fd,__buf_01,(size_t)pCVar7);
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"ErrorMask","");
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Error mask","");
    pCVar7 = &local_208;
    LogImage::LogImage((LogImage *)local_328,&local_388,&local_3a8,pCVar7,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    TVar2 = local_4b8;
    LogImage::write((LogImage *)local_328,local_4b8.order,__buf_02,(size_t)pCVar7);
    TestLog::endImageSet((TestLog *)TVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_p != local_2f8) {
      operator_delete(local_308._M_p,local_2f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_328._4_4_,local_328._0_4_) != &local_318) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_328._4_4_,local_328._0_4_),
                      local_318._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != local_268) {
      operator_delete(local_278._M_p,local_268[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_298._4_4_,local_298._0_4_) != &local_288) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_298._4_4_,local_298._0_4_),
                      local_288._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_description._M_dataplus._M_p != &local_368.m_description.field_2) {
      operator_delete(local_368.m_description._M_dataplus._M_p,
                      local_368.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
      operator_delete(local_368.m_name._M_dataplus._M_p,
                      local_368.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    _Var8._M_p = local_468._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p == &local_468.field_2) goto LAB_01995dd9;
  }
  else {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      if (uVar6 == 3) break;
      uVar4 = uVar6 + 1;
    } while (local_1b8[uVar6 + 1] != '\0');
    bVar9 = 2 < uVar6;
    if (logMode == COMPARE_LOG_EVERYTHING || !bVar9) goto LAB_0199586e;
    if (logMode != COMPARE_LOG_RESULT) goto LAB_01995dd9;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_4a8,&local_498);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_328,local_440,(allocator<char> *)&local_3c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,local_448,(allocator<char> *)&local_3e8);
    LogImageSet::LogImageSet((LogImageSet *)local_298,(string *)local_328,&local_368.m_name);
    TestLog::startImageSet
              ((TestLog *)TVar2,(char *)CONCAT44(local_298._4_4_,local_298._0_4_),local_278._M_p);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"Result","");
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"Result","");
    LogImage::LogImage((LogImage *)local_1b8,&local_468,&local_488,result,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b8,__fd,__buf,(size_t)result);
    TestLog::endImageSet((TestLog *)TVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != local_268) {
      operator_delete(local_278._M_p,local_268[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_298._4_4_,local_298._0_4_) != &local_288) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_298._4_4_,local_298._0_4_),
                      local_288._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
      operator_delete(local_368.m_name._M_dataplus._M_p,
                      local_368.m_name.field_2._M_allocated_capacity + 1);
    }
    _Var8._M_p = (pointer)CONCAT44(local_328._4_4_,local_328._0_4_);
    local_468.field_2._M_allocated_capacity = local_318._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p == &local_318) goto LAB_01995dd9;
  }
  operator_delete(_Var8._M_p,local_468.field_2._M_allocated_capacity + 1);
LAB_01995dd9:
  TextureLevel::~TextureLevel(&local_1e0);
  return bVar9;
}

Assistant:

bool floatThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const Vec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	Vec4				maxDiff				(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				Vec4	refPix		= reference.getPixel(x, y, z);
				Vec4	cmpPix		= result.getPixel(x, y, z);

				Vec4	diff		= abs(refPix - cmpPix);
				bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}